

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.h
# Opt level: O3

btScalar __thiscall
btCollisionWorld::ClosestRayResultCallback::addSingleResult
          (ClosestRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btCollisionObject *pbVar5;
  undefined1 auVar6 [16];
  undefined3 in_register_00000011;
  float fVar7;
  
  (this->super_RayResultCallback).m_closestHitFraction = rayResult->m_hitFraction;
  pbVar5 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pbVar5;
  if (CONCAT31(in_register_00000011,normalInWorldSpace) == 0) {
    fVar2 = (rayResult->m_hitNormalLocal).m_floats[0];
    fVar7 = (rayResult->m_hitNormalLocal).m_floats[1];
    fVar1 = (rayResult->m_hitNormalLocal).m_floats[2];
    auVar6._4_4_ = fVar1 * (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[2] +
                   fVar2 * (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[0] +
                   (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[1] * fVar7;
    auVar6._0_4_ = fVar1 * (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[2] +
                   fVar2 * (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] +
                   (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar7;
    auVar6._8_4_ = fVar1 * (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[2] +
                   fVar2 * (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[0] +
                   fVar7 * (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[1];
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_hitNormalWorld).m_floats = auVar6;
  }
  else {
    uVar3 = *(undefined8 *)((rayResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(rayResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar3;
  }
  fVar2 = rayResult->m_hitFraction;
  fVar7 = 1.0 - fVar2;
  uVar3 = *(undefined8 *)(this->m_rayFromWorld).m_floats;
  uVar4 = *(undefined8 *)(this->m_rayToWorld).m_floats;
  *(ulong *)(this->m_hitPointWorld).m_floats =
       CONCAT44(fVar7 * (float)((ulong)uVar3 >> 0x20) + fVar2 * (float)((ulong)uVar4 >> 0x20),
                fVar7 * (float)uVar3 + fVar2 * (float)uVar4);
  (this->m_hitPointWorld).m_floats[2] =
       fVar7 * (this->m_rayFromWorld).m_floats[2] + fVar2 * (this->m_rayToWorld).m_floats[2];
  return rayResult->m_hitFraction;
}

Assistant:

virtual	btScalar	addSingleResult(LocalRayResult& rayResult,bool normalInWorldSpace)
		{
			//caller already does the filter on the m_closestHitFraction
			btAssert(rayResult.m_hitFraction <= m_closestHitFraction);
			
			m_closestHitFraction = rayResult.m_hitFraction;
			m_collisionObject = rayResult.m_collisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = rayResult.m_hitNormalLocal;
			} else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_collisionObject->getWorldTransform().getBasis()*rayResult.m_hitNormalLocal;
			}
			m_hitPointWorld.setInterpolate3(m_rayFromWorld,m_rayToWorld,rayResult.m_hitFraction);
			return rayResult.m_hitFraction;
		}